

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O1

TaskInfo * __thiscall
anon_unknown.dwarf_4fe9e4::BuildEngineImpl::getTaskInfo(BuildEngineImpl *this,Task *task)

{
  int iVar1;
  __node_ptr p_Var2;
  __hash_code in_RCX;
  __hash_code __code;
  Task *local_20;
  
  local_20 = task;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->taskInfosMutex);
  if (iVar1 == 0) {
    p_Var2 = std::
             _Hashtable<llbuild::core::Task_*,_std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_std::allocator<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>,_std::__detail::_Select1st,_std::equal_to<llbuild::core::Task_*>,_std::hash<llbuild::core::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::_M_find_node(&(this->taskInfos)._M_h,
                            (ulong)task % (this->taskInfos)._M_h._M_bucket_count,&local_20,in_RCX);
    if (p_Var2 != (__node_ptr)0x0) {
      p_Var2 = (__node_ptr)
               ((long)&(p_Var2->
                       super__Hash_node_value<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>
                       ).
                       super__Hash_node_value_base<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>_>
                       ._M_storage._M_storage + 8);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->taskInfosMutex);
    return (TaskInfo *)p_Var2;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

TaskInfo* getTaskInfo(Task* task) {
    std::lock_guard<std::mutex> guard(taskInfosMutex);
    auto it = taskInfos.find(task);
    return it == taskInfos.end() ? nullptr : &it->second;
  }